

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall efsw::DirectorySnapshot::updateFile(DirectorySnapshot *this,string *path)

{
  string local_38 [32];
  string *local_18;
  string *path_local;
  DirectorySnapshot *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)path);
  addFile(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DirectorySnapshot::updateFile( std::string path ) {
	addFile( path );
}